

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_drag(ImGuiInputTextState *str,STB_TexteditState *state,float x,float y)

{
  float fVar1;
  StbTexteditRow *in_RSI;
  ImGuiInputTextState *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  StbTexteditRow r;
  int p;
  
  if (*(char *)&in_RSI->ymax != '\0') {
    STB_TEXTEDIT_LAYOUTROW(in_RSI,(ImGuiInputTextState *)CONCAT44(in_XMM0_Da,in_XMM1_Da),0);
  }
  if (in_RSI->x1 == in_RSI->baseline_y_delta) {
    in_RSI->x1 = in_RSI->x0;
  }
  fVar1 = (float)stb_text_locate_coord(in_RDI,(float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
  in_RSI->baseline_y_delta = fVar1;
  in_RSI->x0 = fVar1;
  return;
}

Assistant:

static void stb_textedit_drag(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, float x, float y)
{
   int p = 0;

   // In single-line mode, just always make y = 0. This lets the drag keep working if the mouse
   // goes off the top or bottom of the text
   if( state->single_line )
   {
      StbTexteditRow r;
      STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
      y = r.ymin;
   }

   if (state->select_start == state->select_end)
      state->select_start = state->cursor;

   p = stb_text_locate_coord(str, x, y);
   state->cursor = state->select_end = p;
}